

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

Workitem * __thiscall
LinkedListPool<depspawn::internal::Workitem,true,false>::malloc<depspawn::internal::arg_info*&,int&>
          (LinkedListPool<depspawn::internal::Workitem,true,false> *this,arg_info **args,int *args_1
          )

{
  arg_info *paVar1;
  Workitem *pWVar2;
  int iVar3;
  Workitem *pWVar4;
  long in_FS_OFFSET;
  
  pWVar4 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)this);
  paVar1 = *args;
  iVar3 = *args_1;
  pWVar4->_vptr_Workitem = (_func_int **)&PTR__Workitem_00111920;
  pWVar4->status = Filling;
  pWVar4->optFlags_ = 0;
  pWVar4->deps_mutex_ = (__atomic_flag_base)0x0;
  pWVar4->guard_ = (__atomic_base<char>)0x0;
  pWVar4->nargs_ = (char)iVar3;
  pWVar4->args = paVar1;
  pWVar4->next = (Workitem *)0x0;
  pWVar2 = *(Workitem **)(in_FS_OFFSET + -8);
  pWVar4->father = pWVar2;
  pWVar4->ndependencies = (__atomic_base<int>)0x0;
  pWVar4->nchildren = (__atomic_base<int>)0x1;
  pWVar4->lastdep = (_dep *)0x0;
  pWVar4->task = (AbstractRunner *)0x0;
  pWVar4->deps = (_dep *)0x0;
  if (pWVar2 != (Workitem *)0x0) {
    LOCK();
    (pWVar2->nchildren).super___atomic_base<int>._M_i =
         (pWVar2->nchildren).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return pWVar4;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }